

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int extraout_EAX;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  char *pcVar5;
  cmdopts_t *__ptr;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  ulonglong uVar12;
  char *pcVar13;
  ulong uVar14;
  void *__ptr_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar15;
  jas_tmr_t enctmr;
  jas_tmr_t dectmr;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  pcVar13 = *argv;
  pcVar5 = strrchr(pcVar13,0x2f);
  cmdname = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    cmdname = pcVar13;
  }
  iVar2 = jas_init();
  if (iVar2 != 0) {
    abort();
  }
  __ptr = cmdopts_parse(argc,argv);
  if (__ptr->version == 0) {
    jas_setdbglevel(__ptr->debug);
    if (__ptr->verbose != 0) {
      cmdinfo();
    }
    pcVar13 = "rb";
    if (__ptr->infile == (char *)0x0) {
LAB_001026f1:
      uVar14 = 0;
      uVar6 = jas_stream_fdopen();
      if (uVar6 != 0) goto LAB_00102701;
      main_cold_10();
LAB_00102916:
      main_cold_9();
LAB_0010291b:
      main_cold_8();
      __ptr_00 = (void *)0x2060;
      puVar11 = (undefined8 *)malloc(0x2060);
      if (puVar11 == (undefined8 *)0x0) {
LAB_00102bab:
        cmdopts_parse_cold_5();
code_r0x00102040:
        cmdopts_parse_cold_4();
        free(__ptr_00);
        return extraout_EAX;
      }
      *puVar11 = 0;
      *(undefined4 *)(puVar11 + 1) = 0xffffffff;
      puVar11[2] = 0;
      *(undefined1 *)(puVar11 + 3) = 0;
      puVar11[0x204] = 0;
      *(undefined4 *)(puVar11 + 0x205) = 0xffffffff;
      puVar11[0x206] = 0;
      *(undefined1 *)(puVar11 + 0x207) = 0;
      *(undefined8 *)((long)puVar11 + 0x203c) = 0;
      *(undefined4 *)((long)puVar11 + 0x2044) = 0;
      puVar11[0x409] = 0xffffffffffffffff;
      *(undefined4 *)(puVar11 + 0x40a) = 0;
      do {
        __ptr_00 = (void *)(uVar14 & 0xffffffff);
        uVar4 = jas_getopt(__ptr_00,pcVar13,cmdopts_parse::cmdoptions);
        pcVar5 = _jas_optarg;
        switch(uVar4) {
        case 0:
          cmdusage();
          goto LAB_00102bab;
        case 1:
          *(undefined4 *)((long)puVar11 + 0x203c) = 1;
          break;
        case 2:
          *puVar11 = _jas_optarg;
          break;
        case 3:
          iVar2 = jas_image_strtofmt(_jas_optarg);
          *(int *)(puVar11 + 1) = iVar2;
          if (iVar2 < 0) {
            fprintf(_stderr,"warning: ignoring invalid input format %s\n",pcVar5);
            *(undefined4 *)(puVar11 + 1) = 0xffffffff;
          }
          break;
        case 4:
          addopt((char *)(puVar11 + 3),0x1000,_jas_optarg);
          puVar11[2] = puVar11 + 3;
          break;
        case 5:
          puVar11[0x204] = _jas_optarg;
          break;
        case 6:
          iVar2 = jas_image_strtofmt(_jas_optarg);
          *(int *)(puVar11 + 0x205) = iVar2;
          if (iVar2 < 0) {
            cmdopts_parse_cold_1();
switchD_001029da_default:
            badusage();
          }
          break;
        case 7:
          addopt((char *)(puVar11 + 0x207),0x1000,_jas_optarg);
          puVar11[0x206] = puVar11 + 0x207;
          break;
        case 8:
          *(undefined4 *)((long)puVar11 + 0x2044) = 1;
          break;
        case 9:
          iVar2 = atoi(_jas_optarg);
          *(int *)(puVar11 + 0x408) = iVar2;
          break;
        case 10:
          iVar2 = atoi(_jas_optarg);
          puVar11[0x409] = (long)iVar2;
          break;
        case 0xb:
          *(undefined4 *)(puVar11 + 0x40a) = 1;
          break;
        case 0xc:
          uVar12 = strtoull(_jas_optarg,(char **)0x0,10);
          puVar11[0x40b] = uVar12;
          break;
        case 0xffffffff:
          __ptr_00 = (void *)(ulong)_jas_optind;
          if ((int)_jas_optind < (int)uVar14) {
            cmdopts_parse_cold_2();
          }
          if (*(int *)((long)puVar11 + 0x2044) == 0) {
            if ((*(int *)(puVar11 + 0x205) < 0) &&
               (__ptr_00 = (void *)puVar11[0x204], __ptr_00 != (void *)0x0)) {
              iVar2 = jas_image_fmtfromname();
              *(int *)(puVar11 + 0x205) = iVar2;
              if (iVar2 < 0) {
                cmdopts_parse_cold_3();
              }
            }
            if (*(int *)(puVar11 + 0x205) < 0) goto code_r0x00102040;
          }
          return (int)puVar11;
        default:
          goto switchD_001029da_default;
        }
      } while( true );
    }
    uVar6 = jas_stream_fopen();
    if (uVar6 == 0) {
      main_cold_2();
      goto LAB_001026f1;
    }
LAB_00102701:
    pcVar13 = "w+b";
    if (__ptr->outfile == (char *)0x0) {
LAB_00102730:
      uVar14 = 1;
      lVar7 = jas_stream_fdopen();
      if (lVar7 == 0) goto LAB_00102916;
    }
    else {
      lVar7 = jas_stream_fopen();
      if (lVar7 == 0) {
        __ptr = (cmdopts_t *)&__ptr->outfile;
        main_cold_3();
        goto LAB_00102730;
      }
    }
    if (__ptr->infmt < 0) {
      uVar14 = uVar6;
      iVar2 = jas_image_getfmt();
      __ptr->infmt = iVar2;
      if (iVar2 < 0) goto LAB_0010291b;
    }
    jas_tmr_start(local_50);
    lVar8 = jas_image_decode(uVar6,__ptr->infmt,__ptr->inopts);
    if (lVar8 == 0) goto LAB_001028e1;
    jas_tmr_stop(local_50);
    uVar15 = jas_tmr_get(local_50);
    if (((-1 < __ptr->cmptno) && (__ptr->cmptno < (long)(ulong)*(uint *)(lVar8 + 0x20))) &&
       (uVar3 = *(uint *)(lVar8 + 0x20) - 1, -1 < (int)uVar3)) {
      uVar14 = (ulong)uVar3;
      do {
        if (uVar14 != __ptr->cmptno) {
          jas_image_delcmpt(lVar8,uVar14 & 0xffffffff);
        }
        bVar1 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar1);
    }
    lVar10 = lVar8;
    if (__ptr->srgb == 0) {
LAB_00102834:
      jas_tmr_start(local_70);
      iVar2 = jas_image_encode(lVar10,lVar7,__ptr->outfmt,__ptr->outopts,in_R8,in_R9,uVar15);
      if (iVar2 != 0) goto LAB_001028e6;
      jas_stream_flush(lVar7);
      jas_tmr_stop(local_70);
      jas_tmr_get(local_70);
      if (__ptr->verbose != 0) {
        main_cold_5();
      }
      jas_stream_close(uVar6);
      iVar2 = jas_stream_close(lVar7);
      if (iVar2 == 0) {
        free(__ptr);
        jas_image_destroy(lVar10);
        jas_image_clearfmts();
        return 0;
      }
      goto LAB_001028eb;
    }
    jas_eprintf("forcing conversion to sRGB\n");
    lVar9 = jas_cmprof_createfromclrspc(0x401);
    if (lVar9 != 0) {
      lVar10 = jas_image_chclrspc(lVar8,lVar9,0);
      if (lVar10 == 0) {
        pcVar13 = "cannot convert to sRGB\n";
        goto LAB_00102900;
      }
      jas_image_destroy(lVar8);
      jas_cmprof_destroy(lVar9);
      goto LAB_00102834;
    }
  }
  else {
    main_cold_1();
LAB_001028e1:
    main_cold_7();
LAB_001028e6:
    main_cold_4();
LAB_001028eb:
    main_cold_6();
  }
  pcVar13 = "cannot create sRGB profile\n";
LAB_00102900:
  jas_eprintf(pcVar13);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	jas_image_t *image;
	cmdopts_t *cmdopts;
	jas_stream_t *in;
	jas_stream_t *out;
	jas_tmr_t dectmr;
	jas_tmr_t enctmr;
	double dectime;
	double enctime;
	int_fast16_t numcmpts;
	int i;

	/* Determine the base name of this command. */
	if ((cmdname = strrchr(argv[0], '/'))) {
		++cmdname;
	} else {
		cmdname = argv[0];
	}

	if (jas_init()) {
		abort();
	}

	/* Parse the command line options. */
	if (!(cmdopts = cmdopts_parse(argc, argv))) {
		fprintf(stderr, "error: cannot parse command line\n");
		exit(EXIT_FAILURE);
	}

	if (cmdopts->version) {
		printf("%s\n", JAS_VERSION);
		fprintf(stderr, "libjasper %s\n", jas_getversion());
		exit(EXIT_SUCCESS);
	}

	jas_setdbglevel(cmdopts->debug);
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	jas_set_max_mem_usage(cmdopts->max_mem);
#endif

	if (cmdopts->verbose) {
		cmdinfo();
	}

	/* Open the input image file. */
	if (cmdopts->infile) {
		/* The input image is to be read from a file. */
		if (!(in = jas_stream_fopen(cmdopts->infile, "rb"))) {
			fprintf(stderr, "error: cannot open input image file %s\n",
			  cmdopts->infile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The input image is to be read from standard input. */
		if (!(in = jas_stream_fdopen(0, "rb"))) {
			fprintf(stderr, "error: cannot open standard input\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Open the output image file. */
	if (cmdopts->outfile) {
		/* The output image is to be written to a file. */
		if (!(out = jas_stream_fopen(cmdopts->outfile, "w+b"))) {
			fprintf(stderr, "error: cannot open output image file %s\n",
			  cmdopts->outfile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The output image is to be written to standard output. */
		if (!(out = jas_stream_fdopen(1, "w+b"))) {
			fprintf(stderr, "error: cannot open standard output\n");
			exit(EXIT_FAILURE);
		}
	}

	if (cmdopts->infmt < 0) {
		if ((cmdopts->infmt = jas_image_getfmt(in)) < 0) {
			fprintf(stderr, "error: input image has unknown format\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Get the input image data. */
	jas_tmr_start(&dectmr);
	if (!(image = jas_image_decode(in, cmdopts->infmt, cmdopts->inopts))) {
		fprintf(stderr, "error: cannot load image data\n");
		exit(EXIT_FAILURE);
	}
	jas_tmr_stop(&dectmr);
	dectime = jas_tmr_get(&dectmr);

	/* If requested, throw away all of the components except one.
	  Why might this be desirable?  It is a hack, really.
	  None of the image formats other than the JPEG-2000 ones support
	  images with two, four, five, or more components.  This hack
	  allows such images to be decoded with the non-JPEG-2000 decoders,
	  one component at a time. */
	numcmpts = jas_image_numcmpts(image);
	if (cmdopts->cmptno >= 0 && cmdopts->cmptno < numcmpts) {
		for (i = numcmpts - 1; i >= 0; --i) {
			if (i != cmdopts->cmptno) {
				jas_image_delcmpt(image, i);
			}
		}
	}

	if (cmdopts->srgb) {
		jas_image_t *newimage;
		jas_cmprof_t *outprof;
		jas_eprintf("forcing conversion to sRGB\n");
		if (!(outprof = jas_cmprof_createfromclrspc(JAS_CLRSPC_SRGB))) {
			jas_eprintf("cannot create sRGB profile\n");
			exit(EXIT_FAILURE);
		}
		if (!(newimage = jas_image_chclrspc(image, outprof, JAS_CMXFORM_INTENT_PER))) {
			jas_eprintf("cannot convert to sRGB\n");
			exit(EXIT_FAILURE);
		}
		jas_image_destroy(image);
		jas_cmprof_destroy(outprof);
		image = newimage;
	}

	/* Generate the output image data. */
	jas_tmr_start(&enctmr);
	if (jas_image_encode(image, out, cmdopts->outfmt, cmdopts->outopts)) {
		fprintf(stderr, "error: cannot encode image\n");
		exit(EXIT_FAILURE);
	}
	jas_stream_flush(out);
	jas_tmr_stop(&enctmr);
	enctime = jas_tmr_get(&enctmr);

	if (cmdopts->verbose) {
		fprintf(stderr, "decoding time = %f\n", dectime);
		fprintf(stderr, "encoding time = %f\n", enctime);
	}

	/* If this fails, we don't care. */
	(void) jas_stream_close(in);

	/* Close the output image stream. */
	if (jas_stream_close(out)) {
		fprintf(stderr, "error: cannot close output image file\n");
		exit(EXIT_FAILURE);
	}

	cmdopts_destroy(cmdopts);
	jas_image_destroy(image);
	jas_image_clearfmts();

	/* Success at last! :-) */
	return EXIT_SUCCESS;
}